

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TImage.cpp
# Opt level: O3

void __thiscall TUPU::TImage::setURL(TImage *this,string *url)

{
  std::__cxx11::string::_M_assign((string *)&this->m_url);
  (this->m_path)._M_string_length = 0;
  *(this->m_path)._M_dataplus._M_p = '\0';
  free(this->m_buffer);
  this->m_len = 0;
  (this->m_filename)._M_string_length = 0;
  *(this->m_filename)._M_dataplus._M_p = '\0';
  return;
}

Assistant:

void TImage::setURL(const string & url)
{
    m_url = url;
    m_path.clear();
    std::free(m_buffer);
    m_len = 0;
    m_filename.clear();
}